

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

int __thiscall
glslang::TDefaultIoResolverBase::resolveSet
          (TDefaultIoResolverBase *this,EShLanguage stage,TVarEntryInfo *ent)

{
  pointer pbVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  long lVar5;
  TIntermediate *pTVar6;
  long *plVar4;
  
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
  if ((*(uint *)(lVar5 + 0x1c) & 0x3f8000) == 0x1f8000) {
    pTVar6 = this->stageIntermediates[stage];
    if (pTVar6 == (TIntermediate *)0x0) {
      pTVar6 = this->referenceIntermediate;
    }
    pbVar1 = (pTVar6->resourceSetBinding).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = 0;
    if ((long)(pTVar6->resourceSetBinding).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x20) {
      uVar3 = atoi((pbVar1->_M_dataplus)._M_p);
    }
  }
  else {
    lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
    uVar3 = *(uint *)(lVar5 + 0x1c) >> 0xf & 0x7f;
  }
  ent->newSet = uVar3;
  return uVar3;
}

Assistant:

int TDefaultIoResolverBase::resolveSet(EShLanguage stage, TVarEntryInfo& ent) {
    const TType& type = ent.symbol->getType();
    if (type.getQualifier().hasSet()) {
        return ent.newSet = type.getQualifier().layoutSet;
    }
    // If a command line or API option requested a single descriptor set, use that (if not overrided by spaceN)
    if (getResourceSetBinding(stage).size() == 1) {
        return ent.newSet = atoi(getResourceSetBinding(stage)[0].c_str());
    }
    return ent.newSet = 0;
}